

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QFontDatabasePrivate::ApplicationFont::Properties>::clear
          (QList<QFontDatabasePrivate::ApplicationFont::Properties> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QFontDatabasePrivate::ApplicationFont::Properties> *this_00;
  __off_t __length;
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QFontDatabasePrivate::ApplicationFont::Properties> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::needsDetach
                      (in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties> *)
               &DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::allocatedCapacity
                (in_RDI);
      QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::swap
                (in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::~QArrayDataPointer
                (in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QFontDatabasePrivate::ApplicationFont::Properties> *)
                QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::operator->
                          (in_RDI);
      QtPrivate::QGenericArrayOps<QFontDatabasePrivate::ApplicationFont::Properties>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }